

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBase * ParseTerminal(ParseContext *ctx)

{
  LexemeType LVar1;
  uint uVar2;
  Lexeme *pos;
  Lexeme *pLVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SynBase *pSVar7;
  undefined4 extraout_var_02;
  SynBase *pSVar8;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  SynNumber *pSVar9;
  SynNew *pSVar10;
  SynFunctionDefinition *pSVar11;
  SynShortFunctionDefinition *pSVar12;
  undefined4 uVar13;
  char *pcVar14;
  SynBase *unaff_R15;
  undefined4 extraout_var_03;
  
  pos = ctx->currentLexeme;
  if (pos->type == lex_true) {
    ctx->currentLexeme = pos + 1;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar7 = (SynBase *)CONCAT44(extraout_var,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar7,0xe,pos,ctx->currentLexeme + -1);
      pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f79a0;
      pSVar7->field_0x3a = 1;
      return pSVar7;
    }
    goto LAB_002221d6;
  }
  if (ctx->currentLexeme->type == lex_false) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar7 = (SynBase *)CONCAT44(extraout_var_00,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar7,0xe,pos,ctx->currentLexeme + -1);
      pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f79a0;
      pSVar7->field_0x3a = 0;
      return pSVar7;
    }
    goto LAB_002221d6;
  }
  if (ctx->currentLexeme->type == lex_nullptr) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar7 = (SynBase *)CONCAT44(extraout_var_01,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar7,0x10,pos,ctx->currentLexeme + -1);
      pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f79d8;
      return pSVar7;
    }
    goto LAB_002221d6;
  }
  if (ctx->currentLexeme->type == lex_bitand) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    pSVar7 = ParseComplexTerminal(ctx);
    if (pSVar7 == (SynBase *)0x0) {
      anon_unknown.dwarf_16d1cf::Report
                (ctx,ctx->currentLexeme,"ERROR: variable not found after \'&\'");
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar7 = (SynBase *)CONCAT44(extraout_var_02,iVar6);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002221d6;
      SynBase::SynBase(pSVar7,0,pos,ctx->currentLexeme + -1);
      pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pSVar8 = (SynBase *)CONCAT44(extraout_var_03,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar8,0x1d,pos,ctx->currentLexeme + -1);
      pSVar8->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7a10;
      pSVar8[1]._vptr_SynBase = (_func_int **)pSVar7;
      return pSVar8;
    }
    goto LAB_002221d6;
  }
  pLVar3 = ctx->currentLexeme;
  LVar1 = pLVar3->type;
  if ((int)LVar1 < 10) {
    if (LVar1 == lex_semiquotedchar) {
      pp_Var4 = (_func_int **)pLVar3->pos;
      uVar2 = pLVar3->length;
      ctx->currentLexeme = pLVar3 + 1;
      if (((ulong)uVar2 == 1) || (*(char *)((long)pp_Var4 + (ulong)(uVar2 - 1)) != '\'')) {
        pcVar14 = "ERROR: unclosed character constant";
      }
      else if ((uVar2 < 4) || ((uVar2 == 4 && (*(char *)((long)pp_Var4 + 1) == '\\')))) {
        if (2 < uVar2) {
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar7 = (SynBase *)CONCAT44(extraout_var_10,iVar6);
          if (ctx->firstLexeme < ctx->currentLexeme) {
            SynBase::SynBase(pSVar7,0x11,pos,ctx->currentLexeme + -1);
            pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7a48;
            pSVar7[1]._vptr_SynBase = pp_Var4;
            *(ulong *)&pSVar7[1].typeID = (long)pp_Var4 + (ulong)uVar2;
            return pSVar7;
          }
          goto LAB_002221d6;
        }
        pcVar14 = "ERROR: empty character constant";
      }
      else {
        pcVar14 = "ERROR: only one character can be inside single quotes";
      }
      anon_unknown.dwarf_16d1cf::Stop(ctx,pos,pcVar14);
    }
    if (LVar1 == lex_add) {
      uVar13 = 1;
      goto LAB_00221dff;
    }
LAB_0022214f:
    uVar13 = 0;
    bVar5 = true;
  }
  else {
    if (LVar1 == lex_sub) {
      uVar13 = 2;
    }
    else if (LVar1 == lex_bitnot) {
      uVar13 = 3;
    }
    else {
      if (LVar1 != lex_lognot) goto LAB_0022214f;
      uVar13 = 4;
    }
LAB_00221dff:
    bVar5 = false;
  }
  if (!bVar5) {
    pcVar14 = pLVar3->pos;
    uVar2 = pLVar3->length;
    if (LVar1 != lex_none) {
      ctx->currentLexeme = pLVar3 + 1;
    }
    pSVar7 = ParseTerminal(ctx);
    if (pSVar7 == (SynBase *)0x0) {
      anon_unknown.dwarf_16d1cf::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'%.*s\'",(ulong)uVar2,
                 pcVar14);
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar7 = (SynBase *)CONCAT44(extraout_var_04,iVar6);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002221d6;
      SynBase::SynBase(pSVar7,0,pos,ctx->currentLexeme + -1);
      pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    unaff_R15 = (SynBase *)CONCAT44(extraout_var_05,iVar6);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002221d6;
    SynBase::SynBase(unaff_R15,0x2f,pos,ctx->currentLexeme + -1);
    unaff_R15->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7a80;
    *(undefined4 *)&unaff_R15->field_0x3c = uVar13;
    unaff_R15[1]._vptr_SynBase = (_func_int **)pSVar7;
  }
  if (!bVar5) {
    return unaff_R15;
  }
  if (ctx->currentLexeme->type == lex_dec) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    pSVar7 = ParseTerminal(ctx);
    if (pSVar7 == (SynBase *)0x0) {
      anon_unknown.dwarf_16d1cf::Report
                (ctx,ctx->currentLexeme,"ERROR: variable not found after \'--\'");
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar7 = (SynBase *)CONCAT44(extraout_var_06,iVar6);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002221d6;
      SynBase::SynBase(pSVar7,0,pos,ctx->currentLexeme + -1);
      pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar8 = (SynBase *)CONCAT44(extraout_var_07,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar8,0x1b,pos,ctx->currentLexeme + -1);
      pSVar8->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7ab8;
      pSVar8[1]._vptr_SynBase = (_func_int **)pSVar7;
      *(undefined1 *)&pSVar8[1].typeID = 0;
      return pSVar8;
    }
  }
  else {
    if (ctx->currentLexeme->type != lex_inc) {
      pSVar9 = ParseNumber(ctx);
      if (pSVar9 != (SynNumber *)0x0) {
        return &pSVar9->super_SynBase;
      }
      pSVar10 = ParseNew(ctx);
      if (pSVar10 != (SynNew *)0x0) {
        return &pSVar10->super_SynBase;
      }
      pSVar7 = ParseSizeof(ctx);
      if (pSVar7 != (SynBase *)0x0) {
        return pSVar7;
      }
      pSVar11 = ParseFunctionDefinition(ctx);
      if (pSVar11 == (SynFunctionDefinition *)0x0) {
        pSVar12 = ParseShortFunctionDefinition(ctx);
        if (pSVar12 == (SynShortFunctionDefinition *)0x0) {
          pSVar7 = ParseComplexTerminal(ctx);
          return pSVar7;
        }
        return &pSVar12->super_SynBase;
      }
      return &pSVar11->super_SynBase;
    }
    ctx->currentLexeme = ctx->currentLexeme + 1;
    pSVar7 = ParseTerminal(ctx);
    if (pSVar7 == (SynBase *)0x0) {
      anon_unknown.dwarf_16d1cf::Report
                (ctx,ctx->currentLexeme,"ERROR: variable not found after \'++\'");
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar7 = (SynBase *)CONCAT44(extraout_var_08,iVar6);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002221d6;
      SynBase::SynBase(pSVar7,0,pos,ctx->currentLexeme + -1);
      pSVar7->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar8 = (SynBase *)CONCAT44(extraout_var_09,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar8,0x1b,pos,ctx->currentLexeme + -1);
      pSVar8->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7ab8;
      pSVar8[1]._vptr_SynBase = (_func_int **)pSVar7;
      *(undefined1 *)&pSVar8[1].typeID = 1;
      return pSVar8;
    }
  }
LAB_002221d6:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynBase* ParseTerminal(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_true))
		return new (ctx.get<SynBool>()) SynBool(start, ctx.Previous(), true);

	if(ctx.Consume(lex_false))
		return new (ctx.get<SynBool>()) SynBool(start, ctx.Previous(), false);

	if(ctx.Consume(lex_nullptr))
		return new (ctx.get<SynNullptr>()) SynNullptr(start, ctx.Previous());

	if(ctx.Consume(lex_bitand))
	{
		SynBase *node = ParseComplexTerminal(ctx);

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '&'");

			node = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynGetAddress>()) SynGetAddress(start, ctx.Previous(), node);
	}

	if(ctx.At(lex_semiquotedchar))
	{
		InplaceStr str = ctx.Consume();

		if(str.length() == 1 || str.begin[str.length() - 1] != '\'')
			Stop(ctx, start, "ERROR: unclosed character constant");
		else if((str.length() > 3 && str.begin[1] != '\\') || str.length() > 4)
			Stop(ctx, start, "ERROR: only one character can be inside single quotes");
		else if(str.length() < 3)
			Stop(ctx, start, "ERROR: empty character constant");

		return new (ctx.get<SynCharacter>()) SynCharacter(start, ctx.Previous(), str);
	}

	if(SynUnaryOpType type = GetUnaryOpType(ctx.Peek()))
	{
		InplaceStr name = ctx.Consume();

		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '%.*s'", name.length(), name.begin);

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynUnaryOp>()) SynUnaryOp(start, ctx.Previous(), type, value);
	}

	if(ctx.Consume(lex_dec))
	{
		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '--'");

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynPreModify>()) SynPreModify(start, ctx.Previous(), value, false);
	}

	if(ctx.Consume(lex_inc))
	{
		SynBase *value = ParseTerminal(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: variable not found after '++'");

			value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		return new (ctx.get<SynPreModify>()) SynPreModify(start, ctx.Previous(), value, true);
	}

	if(SynNumber *node = ParseNumber(ctx))
		return node;

	if(SynNew *node = ParseNew(ctx))
		return node;

	if(SynBase *node = ParseSizeof(ctx))
		return node;

	if(SynBase *node = ParseFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseShortFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseComplexTerminal(ctx))
		return node;

	return NULL;
}